

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuaternion.h
# Opt level: O2

void __thiscall
chrono::ChQuaternion<double>::Qdtdt_from_Aabs
          (ChQuaternion<double> *this,ChVector<double> *a,ChQuaternion<double> *q,
          ChQuaternion<double> *q_dt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [16];
  ChQuaternion<double> qtmpb;
  ChQuaternion<double> qwo;
  ChQuaternion<double> local_d8;
  ChQuaternion<double> local_b8;
  ChQuaternion<double> local_98;
  ChQuaternion<double> local_70;
  ChQuaternion<double> local_50;
  
  local_50.m_data[0] = 0.0;
  local_50.m_data[1] = a->m_data[0];
  local_50.m_data[2] = a->m_data[1];
  local_50.m_data[3] = a->m_data[2];
  local_b8.m_data = (double  [4])(ZEXT832(0) << 0x20);
  local_d8.m_data = (double  [4])(ZEXT832(0) << 0x20);
  local_70.m_data[0] = q->m_data[0];
  auVar2._0_8_ = -q->m_data[3];
  auVar2._8_4_ = 0;
  auVar2._12_4_ = 0x80000000;
  local_70.m_data[1]._0_4_ = *(undefined4 *)(q->m_data + 1);
  local_70.m_data[2]._0_4_ = *(undefined4 *)(q->m_data + 2);
  local_70.m_data[1]._4_4_ = *(uint *)((long)q->m_data + 0xc) ^ 0x80000000;
  local_70.m_data[2]._4_4_ = *(uint *)((long)q->m_data + 0x14) ^ 0x80000000;
  local_70.m_data[3] = (double)vmovlps_avx(auVar2);
  local_98.m_data = local_b8.m_data;
  Cross(&local_98,q_dt,&local_70);
  Cross(&local_d8,&local_98,q_dt);
  Cross(&local_b8,&local_50,q);
  auVar1._8_8_ = 0x3fe0000000000000;
  auVar1._0_8_ = 0x3fe0000000000000;
  auVar1._16_8_ = 0x3fe0000000000000;
  auVar1._24_8_ = 0x3fe0000000000000;
  auVar1 = vmulpd_avx512vl((undefined1  [32])local_b8.m_data,auVar1);
  this->m_data[0] = auVar1._0_8_ + local_d8.m_data[0];
  this->m_data[1] = auVar1._8_8_ + local_d8.m_data[1];
  this->m_data[2] = auVar1._16_8_ + local_d8.m_data[2];
  this->m_data[3] = auVar1._24_8_ + local_d8.m_data[3];
  return;
}

Assistant:

inline void ChQuaternion<Real>::Qdtdt_from_Aabs(const ChVector<Real>& a,
                                                const ChQuaternion<Real>& q,
                                                const ChQuaternion<Real>& q_dt) {
    ChQuaternion<Real> qao(0, a);
    ChQuaternion<Real> qwo;
    ChQuaternion<Real> qtmpa;
    ChQuaternion<Real> qtmpb;
    qwo.Cross(q_dt, q.GetConjugate());
    qtmpb.Cross(qwo, q_dt);
    qtmpa.Cross(qao, q);
    qtmpa.Scale((Real)0.5);
    this->Add(qtmpa, qtmpb);
}